

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::compute_hash_compute_pipeline
               (StateRecorder *recorder,VkComputePipelineCreateInfo *create_info,Hash *out_hash)

{
  void **ppvVar1;
  byte bVar2;
  VkShaderModule module;
  VkSpecializationInfo *spec;
  bool bVar3;
  uint uVar4;
  VkBaseInStructure *base_in;
  int *piVar5;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar6;
  byte *pbVar7;
  ulong uVar8;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  ulong uVar9;
  ulong uVar10;
  Hash hash;
  ulong local_40;
  Hasher local_38;
  
  if (((create_info->stage).pName != (char *)0x0) &&
     (bVar3 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&local_40),
     bVar3)) {
    uVar10 = 0xaf63bd4c8601b7df;
    uVar8 = (local_40 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ local_40 >> 0x20;
    for (piVar5 = (int *)create_info->pNext; piVar5 != (int *)0x0; piVar5 = *(int **)(piVar5 + 2)) {
      if (*piVar5 == 0x3ba1f5f5) {
        uVar8 = uVar8 * 0x100000001b3;
        uVar4 = create_info->flags;
        goto LAB_0012722b;
      }
    }
    uVar4 = create_info->flags;
    uVar8 = uVar8 * 0x100000001b3 ^ (ulong)(uVar4 & 0x7ffffc3f);
LAB_0012722b:
    if (((uVar4 & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
      uVar8 = uVar8 * 0x100000001b3;
    }
    else {
      bVar3 = StateRecorder::get_hash_for_compute_pipeline_handle
                        (recorder,create_info->basePipelineHandle,&local_40);
      if (!bVar3) {
        return false;
      }
      uVar8 = ((local_40 & 0xffffffff ^ uVar8 * 0x100000001b3) * 0x100000001b3 ^ local_40 >> 0x20) *
              0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
    }
    module = (create_info->stage).module;
    if (module == (VkShaderModule)0x0) {
      info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)(create_info->stage).pNext;
      pVVar6 = info;
      if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        return false;
      }
      do {
        if (pVVar6->sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
          if (&DAT_00000003 < pVVar6->pIdentifier) {
            uVar10 = 0xcbf29ce484222325;
            uVar9 = 0;
            do {
              uVar10 = (ulong)*(uint *)(*(long *)(pVVar6 + 1) + uVar9 * 4) ^ uVar10 * 0x100000001b3;
              uVar9 = uVar9 + 1;
            } while ((ulong)pVVar6->pIdentifier >> 2 != uVar9);
            uVar10 = uVar10 * 0x100000001b3;
          }
          local_40 = pVVar6->identifierSize ^ uVar10;
          goto LAB_0012732c;
        }
        ppvVar1 = &pVVar6->pNext;
        pVVar6 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)*ppvVar1;
      } while ((VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)*ppvVar1 !=
               (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0);
      while (info->sType !=
             VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT) {
        info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)info->pNext;
        if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
          return false;
        }
      }
      bVar3 = StateRecorder::Impl::get_hash_for_shader_module(recorder->impl,info,&local_40);
    }
    else {
      bVar3 = StateRecorder::get_hash_for_shader_module(recorder,module,&local_40);
    }
    if (bVar3 != false) {
LAB_0012732c:
      pbVar7 = (byte *)(create_info->stage).pName;
      uVar8 = ((local_40 & 0xffffffff ^ uVar8 * 0x100000001b3) * 0x100000001b3 ^ local_40 >> 0x20) *
              0x100000001b3 ^ 0xff;
      bVar2 = *pbVar7;
      while (bVar2 != 0) {
        pbVar7 = pbVar7 + 1;
        uVar8 = uVar8 * 0x100000001b3 ^ (ulong)bVar2;
        bVar2 = *pbVar7;
      }
      local_38.h = (uVar8 * 0x100000001b3 ^ (ulong)(create_info->stage).flags) * 0x100000001b3 ^
                   (ulong)(create_info->stage).stage;
      spec = (create_info->stage).pSpecializationInfo;
      if (spec == (VkSpecializationInfo *)0x0) {
        local_38.h = local_38.h * 0x100000001b3;
      }
      else {
        hash_specialization_info(&local_38,spec);
      }
      bVar3 = hash_pnext_chain(recorder,&local_38,(create_info->stage).pNext,(DynamicStateInfo *)0x0
                               ,0);
      if (bVar3) {
        bVar3 = hash_pnext_chain(recorder,&local_38,create_info->pNext,(DynamicStateInfo *)0x0,0);
        if (bVar3) {
          *out_hash = local_38.h;
          return true;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool compute_hash_compute_pipeline(const StateRecorder &recorder, const VkComputePipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	if (!create_info.stage.pName)
		return false;

	Hasher h;
	Hash hash;

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_compute_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	// Unfortunately, the hash order is incompatible with compute_hash_stage().
	// For compatibility, cannot change this without a clean break.
	if (create_info.stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(create_info.stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, create_info.stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, create_info.stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	h.string(create_info.stage.pName);
	h.u32(create_info.stage.flags);
	h.u32(create_info.stage.stage);

	if (create_info.stage.pSpecializationInfo)
		hash_specialization_info(h, *create_info.stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.stage.pNext, nullptr, 0))
		return false;

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}